

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)

{
  tm *ptVar1;
  time_t local_28;
  time_t tt;
  tm *pTm;
  Sytm *pOut_local;
  unqlite_vfs *pVfs_local;
  
  pOut_local = (Sytm *)0x0;
  pTm = (tm *)pOut;
  time(&local_28);
  ptVar1 = gmtime(&local_28);
  if (ptVar1 != (tm *)0x0) {
    pTm->tm_hour = ptVar1->tm_hour;
    pTm->tm_min = ptVar1->tm_min;
    pTm->tm_sec = ptVar1->tm_sec;
    pTm->tm_mon = ptVar1->tm_mon;
    pTm->tm_mday = ptVar1->tm_mday;
    pTm->tm_year = ptVar1->tm_year + 0x76c;
    pTm->tm_yday = ptVar1->tm_yday;
    pTm->tm_wday = ptVar1->tm_wday;
    pTm->tm_isdst = ptVar1->tm_isdst;
    pTm->tm_zone = (char *)0x0;
    pTm->tm_gmtoff = 0;
  }
  return 0;
}

Assistant:

static int unixCurrentTime(unqlite_vfs *pVfs,Sytm *pOut)
{
	struct tm *pTm;
	time_t tt;
	SXUNUSED(pVfs);
	time(&tt);
	pTm = gmtime(&tt);
	if( pTm ){ /* Yes, it can fail */
		STRUCT_TM_TO_SYTM(pTm,pOut);
	}
	return UNQLITE_OK;
}